

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintString
          (FastFieldValuePrinter *this,string *val,BaseTextGenerator *generator)

{
  BaseTextGenerator *this_00;
  string local_40;
  BaseTextGenerator *local_20;
  BaseTextGenerator *generator_local;
  string *val_local;
  FastFieldValuePrinter *this_local;
  
  local_20 = generator;
  generator_local = (BaseTextGenerator *)val;
  val_local = (string *)this;
  BaseTextGenerator::PrintLiteral<2ul>(generator,(char (*) [2])0x7703cf);
  this_00 = local_20;
  CEscape(&local_40,(string *)generator_local);
  BaseTextGenerator::PrintString(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  BaseTextGenerator::PrintLiteral<2ul>(local_20,(char (*) [2])0x7703cf);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintString(
    const std::string& val, BaseTextGenerator* generator) const {
  generator->PrintLiteral("\"");
  generator->PrintString(CEscape(val));
  generator->PrintLiteral("\"");
}